

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall SGParser::Generator::RegExprNFAParseElement::Destroy(RegExprNFAParseElement *this)

{
  void *pvVar1;
  ulong uVar2;
  NFA *this_00;
  
  if (this->DataType == Vector) {
    this_00 = (NFA *)(this->field_1).pVec;
    if (this_00 == (NFA *)0x0) goto LAB_0014017d;
    pvVar1 = *(void **)this_00;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)(this_00->FinalState).
                                   super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)pvVar1);
    }
    uVar2 = 0x18;
  }
  else {
    if ((this->DataType != NFA) || (this_00 = (this->field_1).pNFA, this_00 == (NFA *)0x0))
    goto LAB_0014017d;
    NFA::~NFA(this_00);
    uVar2 = 0x28;
  }
  operator_delete(this_00,uVar2);
LAB_0014017d:
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Null:                break;
            case RegExprDataType::NFA:    delete pNFA; break;
            case RegExprDataType::Vector: delete pVec; break;
            case RegExprDataType::Char:                break;
        }
        DataType = RegExprDataType::Null;
    }